

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O1

toptenentry * read_topten(int fd,int limit)

{
  boolean bVar1;
  char *__ptr;
  toptenentry *ptVar2;
  char *pcVar3;
  ulong uVar4;
  toptenentry *tt;
  int size;
  int local_2c;
  
  lseek(fd,0,0);
  __ptr = loadfile(fd,&local_2c);
  ptVar2 = (toptenentry *)calloc((ulong)(limit + 1),0xc0);
  if (__ptr != (char *)0x0) {
    if (0 < limit) {
      uVar4 = (ulong)(uint)limit;
      pcVar3 = __ptr;
      tt = ptVar2;
      do {
        bVar1 = readentry(pcVar3,tt);
        if (bVar1 == '\0') break;
        pcVar3 = strchr(pcVar3,10);
        pcVar3 = pcVar3 + 1;
        tt = tt + 1;
        uVar4 = uVar4 - 1;
      } while (uVar4 != 0);
    }
    free(__ptr);
  }
  return ptVar2;
}

Assistant:

static struct toptenentry *read_topten(int fd, int limit)
{
    int i, size;
    struct toptenentry *ttlist;
    char *data, *line;
    
    lseek(fd, 0, SEEK_SET);
    data = loadfile(fd, &size);
    if (!data)
	/* the only sensible reason for not getting any data is that the record
	 * file doesn't exist or is empty. If it does have data but is unreadable
	 * for some other reason, writing will fail later on, so pretending it's
	 * empty won't hurt anything. */
	return calloc(limit + 1, sizeof(struct toptenentry));
   
    ttlist = calloc(limit + 1, sizeof(struct toptenentry));
    line = data;
    for (i = 0; i < limit; i++) {
	if (!readentry(line, &ttlist[i]))
	    break;
	line = strchr(line, '\n') + 1;
    }
    
    free(data);
    return ttlist;
}